

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  int *piVar1;
  stbtt_vertex *psVar2;
  byte bVar3;
  byte bVar4;
  short sVar5;
  uchar *puVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  stbtt_int32 cx;
  stbtt_int32 cy;
  ushort uVar11;
  ImGuiContext *pIVar12;
  uint uVar13;
  int num_vertices;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  stbtt_vertex *vertices;
  ushort *puVar17;
  size_t sVar18;
  stbtt_vertex *__dest;
  int iVar19;
  int iVar20;
  ulong uVar21;
  short sVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  byte bVar26;
  short sVar27;
  byte bVar28;
  int sx;
  int sy;
  ushort uVar29;
  int iVar30;
  stbtt_int32 sVar31;
  int iVar32;
  stbtt_int32 sVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar40;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar41;
  float fVar42;
  ushort *local_98;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  stbtt_vertex *comp_verts;
  stbtt_vertex **local_40;
  uchar *local_38;
  
  puVar6 = info->data;
  uVar13 = stbtt__GetGlyfOffset(info,glyph_index);
  *pvertices = (stbtt_vertex *)0x0;
  pIVar12 = GImGui;
  uVar15 = 0;
  if (-1 < (int)uVar13) {
    uVar16 = (ulong)uVar13;
    uVar11 = CONCAT11(puVar6[uVar16],puVar6[uVar16 + 1]);
    local_40 = pvertices;
    if ((short)uVar11 < 1) {
      if (uVar11 == 0xffff) {
        vertices = (stbtt_vertex *)0x0;
        uVar15 = 0;
        puVar17 = (ushort *)(puVar6 + uVar16 + 10);
        do {
          comp_verts = (stbtt_vertex *)0x0;
          bVar26 = *(byte *)((long)puVar17 + 1);
          if ((bVar26 & 2) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                          ,0x586,
                          "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
          }
          if ((bVar26 & 1) == 0) {
            iVar19 = (int)(char)puVar17[2];
            iVar23 = (int)((long)((ulong)*(byte *)((long)puVar17 + 5) << 0x38) >> 0x38);
            lVar25 = 6;
          }
          else {
            auVar8._9_7_ = 0;
            auVar8._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
            auVar7._10_6_ = 0;
            auVar7._0_10_ = SUB1610(auVar8 << 0x38,6);
            auVar39._11_5_ = 0;
            auVar39._0_11_ = SUB1611(auVar7 << 0x30,5);
            auVar9._1_12_ = SUB1612(auVar39 << 0x28,4);
            auVar9[0] = (char)puVar17[3];
            auVar9._13_3_ = 0;
            auVar35._1_14_ = SUB1614(auVar9 << 0x18,2);
            auVar35[0] = (char)puVar17[2];
            auVar35[0xf] = 0;
            auVar35 = ZEXT416((uint)*(byte *)((long)puVar17 + 7) << 0x10 |
                              (uint)*(byte *)((long)puVar17 + 5)) | auVar35 << 8;
            iVar19 = (int)auVar35._0_2_;
            iVar23 = (int)auVar35._2_2_;
            lVar25 = 8;
          }
          local_98 = (ushort *)(lVar25 + (long)puVar17);
          if ((bVar26 & 8) == 0) {
            if ((bVar26 & 0x40) != 0) {
              uVar11 = *local_98;
              fVar37 = (float)(int)(short)(local_98[1] << 8 | local_98[1] >> 8) * 6.1035156e-05;
              local_98 = local_98 + 2;
              _local_58 = ZEXT416((uint)((float)(int)(short)(uVar11 << 8 | uVar11 >> 8) *
                                        6.1035156e-05));
              goto LAB_0016eec1;
            }
            if ((char)bVar26 < '\0') {
              local_58._0_4_ =
                   (float)(int)CONCAT11((char)*local_98,*(undefined1 *)((long)local_98 + 1)) *
                   6.1035156e-05;
              local_58._4_4_ =
                   (float)(int)((long)((ulong)CONCAT11((char)local_98[2],
                                                       *(undefined1 *)((long)local_98 + 5)) << 0x30)
                               >> 0x30) * 6.1035156e-05;
              register0x00001288 = 0;
              local_78._0_4_ =
                   (float)(int)CONCAT11((char)local_98[1],*(undefined1 *)((long)local_98 + 3)) *
                   6.1035156e-05;
              local_78._4_4_ =
                   (float)(int)((long)((ulong)CONCAT11((char)local_98[3],
                                                       *(undefined1 *)((long)local_98 + 7)) << 0x30)
                               >> 0x30) * 6.1035156e-05;
              _fStack_70 = 0;
              local_98 = local_98 + 4;
            }
            else {
              _local_58 = ZEXT812(0x3f800000);
              fStack_4c = 0.0;
              _local_78 = ZEXT816(0x3f80000000000000);
            }
          }
          else {
            fVar37 = (float)(int)(short)(*local_98 << 8 | *local_98 >> 8) * 6.1035156e-05;
            local_98 = local_98 + 1;
            register0x00001244 = SUB1612((undefined1  [16])0x0,4);
            local_58._0_4_ = fVar37;
LAB_0016eec1:
            _local_78 = ZEXT416((uint)fVar37) << 0x20;
          }
          uVar13 = stbtt_GetGlyphShape(info,(uint)(ushort)(puVar17[1] << 8 | puVar17[1] >> 8),
                                       &comp_verts);
          psVar2 = comp_verts;
          if (0 < (int)uVar13) {
            auVar34._0_4_ = (float)local_78._0_4_ * (float)local_78._0_4_;
            auVar34._4_4_ = (float)local_78._4_4_ * (float)local_78._4_4_;
            auVar34._8_4_ = fStack_70 * fStack_70;
            auVar34._12_4_ = fStack_6c * fStack_6c;
            auVar36._0_4_ = (float)local_58._0_4_ * (float)local_58._0_4_ + auVar34._0_4_;
            auVar36._4_4_ = (float)local_58._4_4_ * (float)local_58._4_4_ + auVar34._4_4_;
            auVar36._8_4_ = fStack_50 * fStack_50 + auVar34._8_4_;
            auVar36._12_4_ = fStack_4c * fStack_4c + auVar34._12_4_;
            auVar35 = sqrtps(auVar34,auVar36);
            sVar18 = 0;
            do {
              fVar37 = (float)(int)*(short *)((long)&comp_verts->x + sVar18);
              fVar40 = (float)(int)((long)((ulong)*(ushort *)((long)&comp_verts->cx + sVar18) <<
                                          0x30) >> 0x30);
              fVar41 = (float)(int)*(short *)((long)&comp_verts->y + sVar18);
              fVar42 = (float)(int)((long)((ulong)*(ushort *)((long)&comp_verts->cy + sVar18) <<
                                          0x30) >> 0x30);
              auVar38._0_4_ =
                   (int)((fVar41 * (float)local_58._4_4_ + fVar37 * (float)local_58._0_4_ +
                         (float)iVar19) * auVar35._0_4_);
              auVar38._4_4_ =
                   (int)((fVar41 * (float)local_78._4_4_ + fVar37 * (float)local_78._0_4_ +
                         (float)iVar23) * auVar35._4_4_);
              auVar38._8_4_ =
                   (int)((fVar42 * (float)local_58._4_4_ + fVar40 * (float)local_58._0_4_ +
                         (float)iVar19) * auVar35._0_4_);
              auVar38._12_4_ =
                   (int)((fVar42 * (float)local_78._4_4_ + fVar40 * (float)local_78._0_4_ +
                         (float)iVar23) * auVar35._4_4_);
              auVar39 = packssdw(auVar38,auVar38);
              *(long *)((long)&comp_verts->x + sVar18) = auVar39._0_8_;
              pIVar12 = GImGui;
              sVar18 = sVar18 + 10;
            } while ((ulong)uVar13 * 10 != sVar18);
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + 1;
            __dest = (stbtt_vertex *)(*(pIVar12->IO).MemAllocFn)((ulong)(uVar13 + uVar15) * 10);
            pIVar12 = GImGui;
            if (__dest == (stbtt_vertex *)0x0) {
              if (vertices != (stbtt_vertex *)0x0) {
                piVar1 = &(GImGui->IO).MetricsAllocs;
                *piVar1 = *piVar1 + -1;
                (*(pIVar12->IO).MemFreeFn)(vertices);
              }
              pIVar12 = GImGui;
              piVar1 = &(GImGui->IO).MetricsAllocs;
              *piVar1 = *piVar1 + -1;
              (*(pIVar12->IO).MemFreeFn)(psVar2);
              return 0;
            }
            if (0 < (int)uVar15) {
              memcpy(__dest,vertices,(ulong)uVar15 * 10);
            }
            memcpy(__dest + uVar15,psVar2,(ulong)uVar13 * 10);
            pIVar12 = GImGui;
            if (vertices != (stbtt_vertex *)0x0) {
              piVar1 = &(GImGui->IO).MetricsAllocs;
              *piVar1 = *piVar1 + -1;
              (*(pIVar12->IO).MemFreeFn)(vertices);
            }
            pIVar12 = GImGui;
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
            (*(pIVar12->IO).MemFreeFn)(psVar2);
            vertices = __dest;
            uVar15 = uVar13 + uVar15;
          }
          puVar17 = local_98;
        } while ((bVar26 & 0x20) != 0);
      }
      else {
        if ((short)((ushort)puVar6[uVar16] << 8) < 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                        ,0x5bb,
                        "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
        }
        uVar15 = 0;
        vertices = (stbtt_vertex *)0x0;
      }
    }
    else {
      uVar15 = (uint)uVar11 * 2;
      uVar21 = (ulong)uVar15;
      bVar26 = puVar6[uVar21 + uVar16 + 10];
      bVar28 = puVar6[uVar21 + uVar16 + 0xb];
      bVar3 = puVar6[uVar21 + uVar16 + 8];
      bVar4 = puVar6[uVar21 + uVar16 + 9];
      iVar19 = (uint)bVar4 + (uint)bVar3 * 0x100;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      vertices = (stbtt_vertex *)
                 (*(pIVar12->IO).MemAllocFn)((ulong)((iVar19 + (uint)uVar11 * 2) * 10 + 10));
      if (vertices == (stbtt_vertex *)0x0) {
        return 0;
      }
      local_38 = puVar6 + uVar16 + 10;
      puVar17 = (ushort *)(puVar6 + (ulong)bVar26 * 0x100 + (ulong)bVar28 + uVar21 + uVar16 + 0xc);
      uVar21 = uVar21 & 0xffff;
      local_98._0_4_ = (uint)bVar4;
      iVar23 = (uint)bVar3 * 0x100 + (uint)local_98;
      lVar25 = 0;
      bVar26 = 0;
      bVar28 = 0;
      do {
        if (bVar28 == 0) {
          bVar26 = (byte)*puVar17;
          if ((bVar26 & 8) == 0) {
            puVar17 = (ushort *)((long)puVar17 + 1);
            bVar28 = 0;
          }
          else {
            bVar28 = *(byte *)((long)puVar17 + 1);
            puVar17 = puVar17 + 1;
          }
        }
        else {
          bVar28 = bVar28 - 1;
        }
        (&vertices[uVar21].type)[lVar25] = bVar26;
        lVar25 = lVar25 + 10;
      } while ((ulong)(iVar23 * 2 + 2) * 5 != lVar25);
      lVar25 = 0;
      sVar27 = 0;
      do {
        bVar26 = (&vertices[uVar21].type)[lVar25];
        if ((bVar26 & 2) == 0) {
          if ((bVar26 & 0x10) == 0) {
            sVar27 = sVar27 + (*puVar17 << 8 | *puVar17 >> 8);
            puVar17 = puVar17 + 1;
          }
        }
        else {
          uVar11 = *puVar17;
          puVar17 = (ushort *)((long)puVar17 + 1);
          uVar29 = -(ushort)(byte)uVar11;
          if ((bVar26 & 0x10) != 0) {
            uVar29 = (ushort)(byte)uVar11;
          }
          sVar27 = sVar27 + uVar29;
        }
        *(short *)((long)&vertices[uVar21].x + lVar25) = sVar27;
        lVar25 = lVar25 + 10;
      } while ((ulong)(iVar23 * 2 + 2) * 5 != lVar25);
      lVar25 = 0;
      sVar27 = 0;
      do {
        bVar26 = (&vertices[uVar21].type)[lVar25];
        if ((bVar26 & 4) == 0) {
          if ((bVar26 & 0x20) == 0) {
            sVar27 = sVar27 + (*puVar17 << 8 | *puVar17 >> 8);
            puVar17 = puVar17 + 1;
          }
        }
        else {
          uVar11 = *puVar17;
          puVar17 = (ushort *)((long)puVar17 + 1);
          uVar29 = -(ushort)(byte)uVar11;
          if ((bVar26 & 0x20) != 0) {
            uVar29 = (ushort)(byte)uVar11;
          }
          sVar27 = sVar27 + uVar29;
        }
        *(short *)((long)&vertices[uVar21].y + lVar25) = sVar27;
        lVar25 = lVar25 + 10;
      } while ((ulong)(iVar23 * 2 + 2) * 5 != lVar25);
      num_vertices = 0;
      iVar23 = 0;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_78;
      _local_78 = auVar10 << 0x40;
      iVar14 = 0;
      sVar33 = 0;
      sVar31 = 0;
      sy = 0;
      sx = 0;
      cy = 0;
      cx = 0;
      uVar13 = 0;
      iVar20 = 0;
      do {
        auVar35 = _local_78;
        lVar25 = (long)(int)(uVar15 + iVar23);
        bVar26 = vertices[lVar25].type;
        sVar27 = vertices[lVar25].x;
        sVar5 = vertices[lVar25].y;
        iVar30 = (int)sVar27;
        iVar32 = (int)sVar5;
        if (iVar14 == iVar23) {
          if (iVar23 != 0) {
            num_vertices = stbtt__close_shape(vertices,num_vertices,iVar20,uVar13,sx,sy,sVar31,
                                              sVar33,cx,cy);
          }
          sx = iVar30;
          sy = iVar32;
          if ((bVar26 & 1) == 0) {
            sVar31 = iVar30;
            sVar33 = iVar32;
            if ((vertices[lVar25 + 1].type & 1) == 0) {
              sx = vertices[lVar25 + 1].x + iVar30 >> 1;
              sy = vertices[lVar25 + 1].y + iVar32 >> 1;
            }
            else {
              iVar23 = iVar23 + 1;
              sx = (int)vertices[lVar25 + 1].x;
              sy = (int)vertices[lVar25 + 1].y;
            }
          }
          uVar13 = bVar26 & 1 ^ 1;
          vertices[num_vertices].type = '\x01';
          vertices[num_vertices].x = (short)sx;
          vertices[num_vertices].y = (short)sy;
          vertices[num_vertices].cx = 0;
          vertices[num_vertices].cy = 0;
          iVar20 = local_78._0_4_;
          iVar14 = (ushort)(*(ushort *)(local_38 + (long)iVar20 * 2) << 8 |
                           *(ushort *)(local_38 + (long)iVar20 * 2) >> 8) + 1;
          local_78._4_4_ = 0;
          local_78._0_4_ = iVar20 + 1;
          _fStack_70 = auVar35._8_8_;
          iVar20 = 0;
          iVar24 = iVar23;
          num_vertices = num_vertices + 1;
        }
        else {
          sVar22 = (short)cy;
          iVar24 = iVar23;
          if ((bVar26 & 1) == 0) {
            iVar23 = num_vertices;
            if (iVar20 != 0) {
              iVar23 = num_vertices + 1;
              vertices[num_vertices].type = '\x03';
              vertices[num_vertices].x = (short)((uint)(cx + iVar30) >> 1);
              vertices[num_vertices].y = (short)((uint)(iVar32 + cy) >> 1);
              vertices[num_vertices].cx = (short)cx;
              vertices[num_vertices].cy = sVar22;
            }
            iVar20 = 1;
            num_vertices = iVar23;
            cx = iVar30;
            cy = iVar32;
          }
          else {
            psVar2 = vertices + num_vertices;
            if (iVar20 == 0) {
              psVar2->type = '\x02';
              psVar2->x = sVar27;
              psVar2->y = sVar5;
              psVar2->cx = 0;
              sVar22 = 0;
            }
            else {
              psVar2->type = '\x03';
              psVar2->x = sVar27;
              psVar2->y = sVar5;
              psVar2->cx = (short)cx;
            }
            psVar2->cy = sVar22;
            num_vertices = num_vertices + 1;
            iVar20 = 0;
          }
        }
        iVar23 = iVar24 + 1;
      } while (iVar24 < iVar19);
      uVar15 = stbtt__close_shape(vertices,num_vertices,iVar20,uVar13,sx,sy,sVar31,sVar33,cx,cy);
    }
    *local_40 = vertices;
  }
  return uVar15;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   stbtt_int16 numberOfContours;
   stbtt_uint8 *endPtsOfContours;
   stbtt_uint8 *data = info->data;
   stbtt_vertex *vertices=0;
   int num_vertices=0;
   int g = stbtt__GetGlyfOffset(info, glyph_index);

   *pvertices = NULL;

   if (g < 0) return 0;

   numberOfContours = ttSHORT(data + g);

   if (numberOfContours > 0) {
      stbtt_uint8 flags=0,flagcount;
      stbtt_int32 ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
      stbtt_int32 x,y,cx,cy,sx,sy, scx,scy;
      stbtt_uint8 *points;
      endPtsOfContours = (data + g + 10);
      ins = ttUSHORT(data + g + 10 + numberOfContours * 2);
      points = data + g + 10 + numberOfContours * 2 + 2 + ins;

      n = 1+ttUSHORT(endPtsOfContours + numberOfContours*2-2);

      m = n + 2*numberOfContours;  // a loose bound on how many vertices we might need
      vertices = (stbtt_vertex *) STBTT_malloc(m * sizeof(vertices[0]), info->userdata);
      if (vertices == 0)
         return 0;

      next_move = 0;
      flagcount=0;

      // in first pass, we load uninterpreted data into the allocated array
      // above, shifted to the end of the array so we won't overwrite it when
      // we create our final data starting from the front

      off = m - n; // starting offset for uninterpreted data, regardless of how m ends up being calculated

      // first load flags

      for (i=0; i < n; ++i) {
         if (flagcount == 0) {
            flags = *points++;
            if (flags & 8)
               flagcount = *points++;
         } else
            --flagcount;
         vertices[off+i].type = flags;
      }

      // now load x coordinates
      x=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 2) {
            stbtt_int16 dx = *points++;
            x += (flags & 16) ? dx : -dx; // ???
         } else {
            if (!(flags & 16)) {
               x = x + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].x = (stbtt_int16) x;
      }

      // now load y coordinates
      y=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 4) {
            stbtt_int16 dy = *points++;
            y += (flags & 32) ? dy : -dy; // ???
         } else {
            if (!(flags & 32)) {
               y = y + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].y = (stbtt_int16) y;
      }

      // now convert them to our format
      num_vertices=0;
      sx = sy = cx = cy = scx = scy = 0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         x     = (stbtt_int16) vertices[off+i].x;
         y     = (stbtt_int16) vertices[off+i].y;

         if (next_move == i) {
            if (i != 0)
               num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

            // now start the new one               
            start_off = !(flags & 1);
            if (start_off) {
               // if we start off with an off-curve point, then when we need to find a point on the curve
               // where we can start, and we need to save some state for when we wraparound.
               scx = x;
               scy = y;
               if (!(vertices[off+i+1].type & 1)) {
                  // next point is also a curve point, so interpolate an on-point curve
                  sx = (x + (stbtt_int32) vertices[off+i+1].x) >> 1;
                  sy = (y + (stbtt_int32) vertices[off+i+1].y) >> 1;
               } else {
                  // otherwise just use the next point as our start point
                  sx = (stbtt_int32) vertices[off+i+1].x;
                  sy = (stbtt_int32) vertices[off+i+1].y;
                  ++i; // we're using point i+1 as the starting point, so skip it
               }
            } else {
               sx = x;
               sy = y;
            }
            stbtt_setvertex(&vertices[num_vertices++], STBTT_vmove,sx,sy,0,0);
            was_off = 0;
            next_move = 1 + ttUSHORT(endPtsOfContours+j*2);
            ++j;
         } else {
            if (!(flags & 1)) { // if it's a curve
               if (was_off) // two off-curve control points in a row means interpolate an on-curve midpoint
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
               cx = x;
               cy = y;
               was_off = 1;
            } else {
               if (was_off)
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, x,y, cx, cy);
               else
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vline, x,y,0,0);
               was_off = 0;
            }
         }
      }
      num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
   } else if (numberOfContours == -1) {
      // Compound shapes.
      int more = 1;
      stbtt_uint8 *comp = data + g + 10;
      num_vertices = 0;
      vertices = 0;
      while (more) {
         stbtt_uint16 flags, gidx;
         int comp_num_verts = 0, i;
         stbtt_vertex *comp_verts = 0, *tmp = 0;
         float mtx[6] = {1,0,0,1,0,0}, m, n;
         
         flags = ttSHORT(comp); comp+=2;
         gidx = ttSHORT(comp); comp+=2;

         if (flags & 2) { // XY values
            if (flags & 1) { // shorts
               mtx[4] = ttSHORT(comp); comp+=2;
               mtx[5] = ttSHORT(comp); comp+=2;
            } else {
               mtx[4] = ttCHAR(comp); comp+=1;
               mtx[5] = ttCHAR(comp); comp+=1;
            }
         }
         else {
            // @TODO handle matching point
            STBTT_assert(0);
         }
         if (flags & (1<<3)) { // WE_HAVE_A_SCALE
            mtx[0] = mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
         } else if (flags & (1<<6)) { // WE_HAVE_AN_X_AND_YSCALE
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         } else if (flags & (1<<7)) { // WE_HAVE_A_TWO_BY_TWO
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[2] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         }
         
         // Find transformation scales.
         m = (float) STBTT_sqrt(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
         n = (float) STBTT_sqrt(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

         // Get indexed glyph.
         comp_num_verts = stbtt_GetGlyphShape(info, gidx, &comp_verts);
         if (comp_num_verts > 0) {
            // Transform vertices.
            for (i = 0; i < comp_num_verts; ++i) {
               stbtt_vertex* v = &comp_verts[i];
               stbtt_vertex_type x,y;
               x=v->x; y=v->y;
               v->x = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->y = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
               x=v->cx; y=v->cy;
               v->cx = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->cy = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
            }
            // Append vertices.
            tmp = (stbtt_vertex*)STBTT_malloc((num_vertices+comp_num_verts)*sizeof(stbtt_vertex), info->userdata);
            if (!tmp) {
               if (vertices) STBTT_free(vertices, info->userdata);
               if (comp_verts) STBTT_free(comp_verts, info->userdata);
               return 0;
            }
            if (num_vertices > 0) STBTT_memcpy(tmp, vertices, num_vertices*sizeof(stbtt_vertex));
            STBTT_memcpy(tmp+num_vertices, comp_verts, comp_num_verts*sizeof(stbtt_vertex));
            if (vertices) STBTT_free(vertices, info->userdata);
            vertices = tmp;
            STBTT_free(comp_verts, info->userdata);
            num_vertices += comp_num_verts;
         }
         // More components ?
         more = flags & (1<<5);
      }
   } else if (numberOfContours < 0) {
      // @TODO other compound variations?
      STBTT_assert(0);
   } else {
      // numberOfCounters == 0, do nothing
   }

   *pvertices = vertices;
   return num_vertices;
}